

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int cvLs_AccessLMem(void *cvode_mem,char *fname,CVodeMem *cv_mem,CVLsMem *cvls_mem)

{
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    error_code = -1;
    cvode_mem = (CVodeMem)0x0;
  }
  else {
    *cv_mem = (CVodeMem)cvode_mem;
    if (*(CVLsMem *)((long)cvode_mem + 0x408) != (CVLsMem)0x0) {
      *cvls_mem = *(CVLsMem *)((long)cvode_mem + 0x408);
      return 0;
    }
    msgfmt = "Linear solver memory is NULL.";
    error_code = -2;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,"CVLS",fname,msgfmt);
  return error_code;
}

Assistant:

int cvLs_AccessLMem(void* cvode_mem, const char *fname,
                    CVodeMem *cv_mem, CVLsMem *cvls_mem)
{
  if (cvode_mem==NULL) {
    cvProcessError(NULL, CVLS_MEM_NULL, "CVLS",
                   fname, MSG_LS_CVMEM_NULL);
    return(CVLS_MEM_NULL);
  }
  *cv_mem = (CVodeMem) cvode_mem;
  if ((*cv_mem)->cv_lmem==NULL) {
    cvProcessError(*cv_mem, CVLS_LMEM_NULL, "CVLS",
                   fname, MSG_LS_LMEM_NULL);
    return(CVLS_LMEM_NULL);
  }
  *cvls_mem = (CVLsMem) (*cv_mem)->cv_lmem;
  return(CVLS_SUCCESS);
}